

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> **objToLoad,
               int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  bool bVar1;
  int iVar2;
  MemoryManager *pMVar3;
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *this;
  Grammar *valueToAdopt;
  undefined4 extraout_var;
  void *key;
  XMLSize_t itemIndex;
  ulong uVar4;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    XSerializeEngine::readSize(serEng,&hashModulus);
    this = *objToLoad;
    if (this == (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)0x0) {
      pMVar3 = XSerializeEngine::getMemoryManager(serEng);
      this = (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,pMVar3);
      pMVar3 = XSerializeEngine::getMemoryManager(serEng);
      RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::RefHashTableOf
                (this,hashModulus,toAdopt,pMVar3);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,this);
    itemNumber = 0;
    XSerializeEngine::readSize(serEng,&itemNumber);
    for (uVar4 = 0; uVar4 < itemNumber; uVar4 = uVar4 + 1) {
      valueToAdopt = Grammar::loadGrammar(serEng);
      iVar2 = (*(valueToAdopt->super_XSerializable)._vptr_XSerializable[0x16])(valueToAdopt);
      key = (void *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))
                              ((long *)CONCAT44(extraout_var,iVar2));
      RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::put
                (*objToLoad,key,valueToAdopt);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<Grammar>** objToLoad
                                   , int
                                   , bool                      toAdopt
                                   , XSerializeEngine&         serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<Grammar>(
                                                     hashModulus
                                                   , toAdopt
                                                   , serEng.getMemoryManager()
                                                   );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            Grammar*  data;
            data = Grammar::loadGrammar(serEng);

            XMLCh* key = (XMLCh*) data->getGrammarDescription()->getGrammarKey();
            (*objToLoad)->put(key, data);
        }
    }
}